

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O2

void Saig_SynchTernarySimulate(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  
  uVar10 = 0;
  uVar7 = (ulong)(uint)nWords;
  if (nWords < 1) {
    uVar7 = uVar10;
  }
  while( true ) {
    iVar9 = (int)uVar10;
    if (pAig->vObjs->nSize <= iVar9) break;
    pvVar3 = Vec_PtrEntry(pAig->vObjs,iVar9);
    if ((pvVar3 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7)) {
      pvVar4 = Vec_PtrEntry(vSimInfo,*(int *)((long)pvVar3 + 0x24));
      iVar8 = -1;
      if (*(ulong *)((long)pvVar3 + 8) != 0) {
        iVar8 = *(int *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x24);
      }
      pvVar5 = Vec_PtrEntry(vSimInfo,iVar8);
      iVar8 = -1;
      if (*(ulong *)((long)pvVar3 + 0x10) != 0) {
        iVar8 = *(int *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 0x24);
      }
      pvVar6 = Vec_PtrEntry(vSimInfo,iVar8);
      if ((*(byte *)((long)pvVar3 + 8) & 1) == 0) {
        uVar10 = 0;
        if ((*(ulong *)((long)pvVar3 + 0x10) & 1) == 0) {
          for (; uVar7 != uVar10; uVar10 = uVar10 + 1) {
            uVar2 = Saig_SynchAnd(*(uint *)((long)pvVar5 + uVar10 * 4),
                                  *(uint *)((long)pvVar6 + uVar10 * 4));
            *(uint *)((long)pvVar4 + uVar10 * 4) = uVar2;
          }
        }
        else {
          for (; uVar7 != uVar10; uVar10 = uVar10 + 1) {
            uVar2 = *(uint *)((long)pvVar6 + uVar10 * 4);
            uVar2 = Saig_SynchAnd(*(uint *)((long)pvVar5 + uVar10 * 4),
                                  uVar2 ^ 0x55555555 ^ uVar2 & 0x55555555 & uVar2 >> 1);
            *(uint *)((long)pvVar4 + uVar10 * 4) = uVar2;
          }
        }
      }
      else {
        uVar10 = 0;
        if ((*(ulong *)((long)pvVar3 + 0x10) & 1) == 0) {
          for (; uVar7 != uVar10; uVar10 = uVar10 + 1) {
            uVar2 = *(uint *)((long)pvVar5 + uVar10 * 4);
            uVar2 = Saig_SynchAnd(uVar2 ^ 0x55555555 ^ uVar2 & 0x55555555 & uVar2 >> 1,
                                  *(uint *)((long)pvVar6 + uVar10 * 4));
            *(uint *)((long)pvVar4 + uVar10 * 4) = uVar2;
          }
        }
        else {
          for (; uVar7 != uVar10; uVar10 = uVar10 + 1) {
            uVar2 = *(uint *)((long)pvVar5 + uVar10 * 4);
            uVar1 = *(uint *)((long)pvVar6 + uVar10 * 4);
            uVar2 = Saig_SynchAnd(uVar2 ^ 0x55555555 ^ uVar2 & 0x55555555 & uVar2 >> 1,
                                  uVar1 ^ 0x55555555 ^ uVar1 & 0x55555555 & uVar1 >> 1);
            *(uint *)((long)pvVar4 + uVar10 * 4) = uVar2;
          }
        }
      }
    }
    uVar10 = (ulong)(iVar9 + 1);
  }
  for (iVar9 = 0; iVar9 < pAig->nRegs; iVar9 = iVar9 + 1) {
    pvVar3 = Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar9);
    pvVar4 = Vec_PtrEntry(vSimInfo,*(int *)((long)pvVar3 + 0x24));
    iVar8 = -1;
    if (*(ulong *)((long)pvVar3 + 8) != 0) {
      iVar8 = *(int *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x24);
    }
    pvVar5 = Vec_PtrEntry(vSimInfo,iVar8);
    if ((*(byte *)((long)pvVar3 + 8) & 1) == 0) {
      for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
        *(undefined4 *)((long)pvVar4 + uVar10 * 4) = *(undefined4 *)((long)pvVar5 + uVar10 * 4);
      }
    }
    else {
      for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
        uVar2 = *(uint *)((long)pvVar5 + uVar10 * 4);
        *(uint *)((long)pvVar4 + uVar10 * 4) = uVar2 ^ 0x55555555 ^ uVar2 & 0x55555555 & uVar2 >> 1;
      }
    }
  }
  return;
}

Assistant:

void Saig_SynchTernarySimulate( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords )
{
    Aig_Obj_t * pObj;
    unsigned * pSim0, * pSim1, * pSim;
    int i, w;
    // simulate nodes
    Aig_ManForEachNode( pAig, pObj, i )
    {
        pSim  = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        pSim0 = (unsigned *)Vec_PtrEntry( vSimInfo, Aig_ObjFaninId0(pObj) );
        pSim1 = (unsigned *)Vec_PtrEntry( vSimInfo, Aig_ObjFaninId1(pObj) );
        if ( Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj) )
        {
            for ( w = 0; w < nWords; w++ )
                pSim[w] = Saig_SynchAnd( Saig_SynchNot(pSim0[w]), Saig_SynchNot(pSim1[w]) );
        }
        else if ( !Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj) )
        {
            for ( w = 0; w < nWords; w++ )
                pSim[w] = Saig_SynchAnd( pSim0[w], Saig_SynchNot(pSim1[w]) );
        }
        else if ( Aig_ObjFaninC0(pObj) && !Aig_ObjFaninC1(pObj) )
        {
            for ( w = 0; w < nWords; w++ )
                pSim[w] = Saig_SynchAnd( Saig_SynchNot(pSim0[w]), pSim1[w] );
        }
        else // if ( !Aig_ObjFaninC0(pObj) && !Aig_ObjFaninC1(pObj) )
        {
            for ( w = 0; w < nWords; w++ )
                pSim[w] = Saig_SynchAnd( pSim0[w], pSim1[w] );
        }
    }
    // transfer values to register inputs
    Saig_ManForEachLi( pAig, pObj, i )
    {
        pSim  = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        pSim0 = (unsigned *)Vec_PtrEntry( vSimInfo, Aig_ObjFaninId0(pObj) );
        if ( Aig_ObjFaninC0(pObj) )
        {
            for ( w = 0; w < nWords; w++ )
                pSim[w] = Saig_SynchNot( pSim0[w] );
        }
        else
        {
            for ( w = 0; w < nWords; w++ )
                pSim[w] = pSim0[w];
        }
    }
}